

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall BigNum::BigNum(BigNum *this,string *input)

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  char local_3a;
  char local_39;
  int local_38;
  int local_34;
  
  (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->sign = true;
  iVar3 = (int)*(input->_M_dataplus)._M_p;
  if (9 < iVar3 - 0x30U && iVar3 != 0x2d) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Numbers cannot contain character",0x20);
    local_39 = *(input->_M_dataplus)._M_p;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_39,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  uVar6 = input->_M_string_length;
  if (1 < uVar6) {
    uVar7 = 1;
    do {
      if (9 < (int)(input->_M_dataplus)._M_p[uVar7] - 0x30U) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Numbers cannot contain character",0x20);
        local_3a = (input->_M_dataplus)._M_p[uVar7];
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,&local_3a,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        uVar6 = input->_M_string_length;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar6);
  }
  if (*(input->_M_dataplus)._M_p == '-') {
    this->sign = false;
    uVar4 = (int)uVar6 - 1;
    if (0 < (int)uVar4) {
      lVar8 = (ulong)uVar4 + 1;
      do {
        local_34 = (input->_M_dataplus)._M_p[lVar8 + -1] + -0x30;
        iVar1._M_current =
             (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->digits,iVar1,&local_34);
        }
        else {
          *iVar1._M_current = local_34;
          (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
    }
  }
  else {
    uVar4 = (int)uVar6 - 1;
    if (-1 < (int)uVar4) {
      lVar8 = (ulong)uVar4 + 1;
      do {
        local_38 = (input->_M_dataplus)._M_p[lVar8 + -1] + -0x30;
        iVar1._M_current =
             (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->digits,iVar1,&local_38);
        }
        else {
          *iVar1._M_current = local_38;
          (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        lVar9 = lVar8 + -1;
        bVar2 = 0 < lVar8;
        lVar8 = lVar9;
      } while (lVar9 != 0 && bVar2);
    }
  }
  this->length = (int)((ulong)((long)(this->digits).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->digits).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
  return;
}

Assistant:

BigNum(string input) {
        if (!isdigit(input[0]) && input[0] != '-') {
            cout << "Numbers cannot contain character" << input[0] << endl;
        }
        for (int i = 1; i < input.size(); i++){
            if (!isdigit(input[i]))
                cout << "Numbers cannot contain character" << input[i] << endl;
        }
        if (input[0] == '-') {
            sign = false;
            for (int i = input.size() - 1; i > 0; i--)
                digits.push_back(input[i] - '0');
            length = digits.size();
        } else {
            for (int i = input.size() - 1; i >= 0; i--)
                digits.push_back(input[i] - '0');
            length = digits.size();
        }
    }